

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

FILE * getiofile(lua_State *L,int findex)

{
  FILE *pFVar1;
  long lVar2;
  
  lua_rawgeti(L,-0x2711,findex);
  lVar2 = 0x28;
  if (L->top[-1].tt != 7) {
    lVar2 = 0;
  }
  pFVar1 = *(FILE **)((long)L->top[-1].value.gc + lVar2);
  if (pFVar1 != (FILE *)0x0) {
    return pFVar1;
  }
  luaL_error(L,"standard %s file is closed",
             (long)&fnames_rel + (long)*(int *)((long)&fnames_rel + (ulong)(findex - 1) * 4));
}

Assistant:

static FILE*getiofile(lua_State*L,int findex){
FILE*f;
lua_rawgeti(L,(-10001),findex);
f=*(FILE**)lua_touserdata(L,-1);
if(f==NULL)
luaL_error(L,"standard %s file is closed",fnames[findex-1]);
return f;
}